

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DocumentContextExtenderAdapter.h
# Opt level: O0

EStatusCode __thiscall
DocumentContextExtenderAdapter::OnAfterCreatePageFromPage
          (DocumentContextExtenderAdapter *this,PDFPage *iPageObjectResultPage,
          PDFDictionary *inPageObjectDictionary,ObjectsContext *inPDFWriterObjectContext,
          DocumentContext *inDocumentContext,PDFDocumentHandler *inPDFDocumentHandler)

{
  PDFDocumentHandler *inPDFDocumentHandler_local;
  DocumentContext *inDocumentContext_local;
  ObjectsContext *inPDFWriterObjectContext_local;
  PDFDictionary *inPageObjectDictionary_local;
  PDFPage *iPageObjectResultPage_local;
  DocumentContextExtenderAdapter *this_local;
  
  return eSuccess;
}

Assistant:

virtual PDFHummus::EStatusCode OnAfterCreatePageFromPage(
							PDFPage* iPageObjectResultPage,
							PDFDictionary* inPageObjectDictionary,
							ObjectsContext* inPDFWriterObjectContext,
							PDFHummus::DocumentContext* inDocumentContext,
							PDFDocumentHandler* inPDFDocumentHandler){
	  (void) iPageObjectResultPage;
	  (void) inPageObjectDictionary;
	  (void) inPDFWriterObjectContext;
	  (void) inDocumentContext;
	  (void) inPDFDocumentHandler;
	  return PDFHummus::eSuccess;}